

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O1

int xmlC14NProcessNodeList(xmlC14NCtxPtr ctx,xmlNodePtr cur)

{
  xmlC14NMode xVar1;
  xmlNs *pxVar2;
  xmlC14NVisibleNsStackPtr p_Var3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  xmlChar *pxVar11;
  xmlListPtr pxVar12;
  xmlNodePtr pxVar13;
  void *pvVar14;
  xmlNodePtr pxVar15;
  xmlURIPtr str;
  undefined7 uVar16;
  xmlChar *str1;
  _xmlAttr *data;
  xmlAttrPtr pxVar17;
  char *pcVar18;
  xmlOutputBufferPtr out;
  char *msg;
  char *pcVar19;
  long lVar20;
  xmlNode *node;
  _xmlNode *p_Var21;
  xmlURIPtr base;
  bool bVar22;
  xmlNs ns_default;
  xmlNodePtr local_98;
  xmlNodePtr local_90;
  uint local_74;
  uint local_70;
  xmlNs local_68;
  
  if (cur == (xmlNodePtr)0x0) {
    iVar6 = 0;
  }
  else {
    do {
      pcVar18 = "processing node";
      iVar5 = 1;
      if (ctx->is_visible_callback != (xmlC14NIsVisibleCallback)0x0) {
        iVar5 = (*ctx->is_visible_callback)(ctx->user_data,cur,cur->parent);
      }
      iVar7 = 0;
      iVar6 = 0;
      switch(cur->type) {
      case XML_ELEMENT_NODE:
        for (pxVar2 = cur->nsDef; pxVar2 != (xmlNs *)0x0; pxVar2 = pxVar2->next) {
          iVar6 = xmlStrlen(pxVar2->href);
          if (0 < iVar6) {
            iVar6 = xmlParseURISafe((char *)pxVar2->href,(xmlURIPtr *)&local_68);
            if ((xmlURIPtr)local_68.next == (xmlURIPtr)0x0) {
              if (iVar6 < 0) goto LAB_0015fcc5;
              iVar6 = 0x5b;
              pcVar18 = (char *)0x0;
              msg = "%s";
              pcVar19 = "parsing namespace uri";
              pxVar13 = cur;
              goto LAB_0015fc9d;
            }
            iVar6 = xmlStrlen((xmlChar *)(local_68.next)->next);
            if (iVar6 == 0) {
              xmlC14NErrFull(ctx,(xmlNodePtr)0x0,0x7a3,(char *)(local_68.next)->next,
                             "Relative namespace UR is invalid here : %s\n",(local_68.next)->next);
              xmlFreeURI((xmlURIPtr)local_68.next);
              goto LAB_0015fca4;
            }
            xmlFreeURI((xmlURIPtr)local_68.next);
          }
        }
        p_Var3 = ctx->ns_rendered;
        if (p_Var3 == (xmlC14NVisibleNsStackPtr)0x0) {
          iVar6 = 0;
          pxVar11 = (xmlChar *)0x0;
          xmlC14NErrFull((xmlC14NCtxPtr)0x0,(xmlNodePtr)0x0,0x73,(char *)0x0,"Invalid argument\n",0)
          ;
          local_70 = 0;
          iVar7 = 0;
        }
        else {
          iVar6 = p_Var3->nsCurEnd;
          local_70 = p_Var3->nsPrevStart;
          pxVar11 = (xmlChar *)(ulong)local_70;
          iVar7 = p_Var3->nsPrevEnd;
        }
        if (iVar5 == 0) {
          local_74 = 0;
        }
        else {
          local_74 = ctx->parent_is_doc;
          pxVar11 = (xmlChar *)(ulong)local_74;
          if (local_74 == 0) {
            local_74 = 0;
          }
          else {
            ctx->pos = XMLC14N_INSIDE_DOCUMENT_ELEMENT;
            ctx->parent_is_doc = 0;
          }
          xmlOutputBufferWriteString(ctx->buf,"<");
          if ((cur->ns != (xmlNs *)0x0) && (iVar8 = xmlStrlen(cur->ns->prefix), 0 < iVar8)) {
            xmlOutputBufferWriteString(ctx->buf,(char *)cur->ns->prefix);
            xmlOutputBufferWriteString(ctx->buf,":");
          }
          xmlOutputBufferWriteString(ctx->buf,(char *)cur->name);
        }
        if (ctx->mode != XML_C14N_EXCLUSIVE_1_0) {
          if (cur->type == XML_ELEMENT_NODE) {
            pxVar12 = xmlListCreate((xmlListDeallocator)0x0,xmlC14NNsCompare);
            if (pxVar12 == (xmlListPtr)0x0) goto LAB_0015fcc5;
            bVar4 = false;
            for (p_Var21 = cur; p_Var21 != (xmlNodePtr)0x0; p_Var21 = p_Var21->parent) {
              for (pxVar13 = (xmlNodePtr)p_Var21->nsDef; pxVar13 != (xmlNodePtr)0x0;
                  pxVar13 = (xmlNodePtr)pxVar13->_private) {
                pxVar15 = (xmlNodePtr)xmlSearchNs(cur->doc,cur,(xmlChar *)pxVar13->children);
                if (((pxVar15 == pxVar13) && (iVar8 = xmlC14NIsXmlNs((xmlNsPtr)pxVar13), iVar8 == 0)
                    ) && ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0 ||
                          (iVar8 = (*ctx->is_visible_callback)(ctx->user_data,pxVar13,cur),
                          iVar8 != 0)))) {
                  iVar8 = xmlC14NVisibleNsStackFind(ctx->ns_rendered,(xmlNsPtr)pxVar13);
                  if ((iVar5 != 0) &&
                     (iVar9 = xmlC14NVisibleNsStackAdd(ctx->ns_rendered,(xmlNsPtr)pxVar13,cur),
                     iVar9 < 0)) {
                    if (ctx != (xmlC14NCtxPtr)0x0) {
                      ctx->error = 2;
                    }
                    pxVar11 = (xmlChar *)0x15;
                    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,
                                        (void *)0x0,0x15,(xmlError *)0x0);
                    goto LAB_0015fbc5;
                  }
                  if (iVar8 == 0) {
                    xmlListInsert(pxVar12,pxVar13);
                  }
                  iVar8 = xmlStrlen((xmlChar *)pxVar13->children);
                  if (iVar8 == 0) {
                    bVar4 = true;
                  }
                }
              }
            }
            if ((iVar5 != 0) && (!bVar4)) {
              local_68._private = (void *)0x0;
              local_68.context = (_xmlDoc *)0x0;
              local_68.href = (xmlChar *)0x0;
              local_68.prefix = (xmlChar *)0x0;
              local_68.next = (_xmlNs *)0x0;
              local_68.type = 0;
              local_68._12_4_ = 0;
              iVar8 = xmlC14NVisibleNsStackFind(ctx->ns_rendered,&local_68);
              if (iVar8 == 0) {
                xmlC14NPrintNamespaces(&local_68,ctx);
              }
            }
LAB_0015fbbb:
            xmlListWalk(pxVar12,xmlC14NPrintNamespacesWalker,ctx);
LAB_0015fbc5:
            xmlListDelete(pxVar12);
LAB_0015fbd4:
            if (iVar5 != 0) {
              p_Var3 = ctx->ns_rendered;
              if (p_Var3 == (xmlC14NVisibleNsStackPtr)0x0) {
                pxVar11 = (xmlChar *)0x0;
                xmlC14NErrFull((xmlC14NCtxPtr)0x0,(xmlNodePtr)0x0,0x73,(char *)0x0,
                               "Invalid argument\n",0);
              }
              else {
                pxVar11 = (xmlChar *)(ulong)(uint)p_Var3->nsCurEnd;
                p_Var3->nsPrevStart = p_Var3->nsPrevEnd;
                p_Var3->nsPrevEnd = p_Var3->nsCurEnd;
              }
            }
            if (cur->type == XML_ELEMENT_NODE) {
              pxVar12 = xmlListCreate((xmlListDeallocator)0x0,xmlC14NAttrsCompare);
              if (pxVar12 == (xmlListPtr)0x0) goto LAB_0015fcc5;
              xVar1 = ctx->mode;
              if (xVar1 != XML_C14N_1_1) {
                if (xVar1 == XML_C14N_EXCLUSIVE_1_0) {
                  for (pxVar13 = (xmlNodePtr)cur->properties; pxVar13 != (xmlNodePtr)0x0;
                      pxVar13 = pxVar13->next) {
                    if ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) ||
                       (iVar8 = (*ctx->is_visible_callback)(ctx->user_data,pxVar13,cur), iVar8 != 0)
                       ) {
                      xmlListInsert(pxVar12,pxVar13);
                    }
                  }
                }
                else if (xVar1 == XML_C14N_1_0) {
                  for (pxVar13 = (xmlNodePtr)cur->properties; pxVar13 != (xmlNodePtr)0x0;
                      pxVar13 = pxVar13->next) {
                    if ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) ||
                       (iVar8 = (*ctx->is_visible_callback)(ctx->user_data,pxVar13,cur), iVar8 != 0)
                       ) {
                      xmlListInsert(pxVar12,pxVar13);
                    }
                  }
                  if (iVar5 == 0) goto LAB_00160155;
                  pxVar13 = cur->parent;
                  if ((((pxVar13 != (xmlNodePtr)0x0) &&
                       (ctx->is_visible_callback != (xmlC14NIsVisibleCallback)0x0)) &&
                      (iVar8 = (*ctx->is_visible_callback)(ctx->user_data,pxVar13,pxVar13->parent),
                      iVar8 == 0)) && (p_Var21 = cur->parent, p_Var21 != (_xmlNode *)0x0)) {
                    do {
                      for (data = p_Var21->properties; data != (_xmlAttr *)0x0; data = data->next) {
                        if (((data->ns != (xmlNsPtr)0x0) &&
                            (iVar8 = xmlC14NIsXmlNs(data->ns), iVar8 != 0)) &&
                           (pvVar14 = xmlListSearch(pxVar12,data), pvVar14 == (void *)0x0)) {
                          xmlListInsert(pxVar12,data);
                        }
                      }
                      p_Var21 = p_Var21->parent;
                      pxVar17 = (xmlAttrPtr)0x0;
                    } while (p_Var21 != (_xmlNode *)0x0);
                    goto LAB_001602bb;
                  }
                }
                goto LAB_001602b9;
              }
              pxVar13 = (xmlNodePtr)cur->properties;
              if (pxVar13 == (xmlNodePtr)0x0) {
                pxVar15 = (xmlNodePtr)0x0;
                local_90 = (xmlNodePtr)0x0;
                local_98 = (xmlNodePtr)0x0;
              }
              else {
                local_98 = (xmlNodePtr)0x0;
                local_90 = (xmlNodePtr)0x0;
                pxVar15 = (xmlNodePtr)0x0;
                do {
                  if (((iVar5 == 0) || (pxVar13->ns == (xmlNsPtr)0x0)) ||
                     (iVar8 = xmlC14NIsXmlNs(pxVar13->ns), iVar8 == 0)) {
LAB_0015fe11:
                    if ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) ||
                       (iVar8 = (*ctx->is_visible_callback)(ctx->user_data,pxVar13,cur), iVar8 != 0)
                       ) {
                      xmlListInsert(pxVar12,pxVar13);
                    }
                  }
                  else {
                    pxVar11 = (xmlChar *)0x0;
                    bVar4 = true;
                    if (local_90 == (xmlNodePtr)0x0) {
                      iVar8 = xmlStrEqual(pxVar13->name,"lang");
                      if (iVar8 == 0) {
                        local_90 = (xmlNodePtr)0x0;
                        pxVar11 = (xmlChar *)0x0;
                      }
                      else {
                        pxVar11 = &DAT_00000001;
                        bVar4 = false;
                        local_90 = pxVar13;
                      }
                    }
                    if ((bVar4) && (local_98 == (xmlNodePtr)0x0)) {
                      iVar8 = xmlStrEqual(pxVar13->name,"space");
                      pxVar11 = (xmlChar *)(ulong)(iVar8 != 0);
                      local_98 = (xmlNodePtr)0x0;
                      if (iVar8 != 0) {
                        local_98 = pxVar13;
                      }
                    }
                    if (((int)pxVar11 == 0) && (pxVar15 == (xmlNodePtr)0x0)) {
                      iVar8 = xmlStrEqual(pxVar13->name,"base");
                      pxVar11 = (xmlChar *)(ulong)(iVar8 != 0);
                      pxVar15 = (xmlNodePtr)0x0;
                      if (iVar8 != 0) {
                        pxVar15 = pxVar13;
                      }
                    }
                    if ((int)pxVar11 == 0) goto LAB_0015fe11;
                  }
                  pxVar13 = pxVar13->next;
                } while (pxVar13 != (_xmlNode *)0x0);
              }
              if (iVar5 == 0) {
LAB_00160155:
                xmlListWalk(pxVar12,xmlC14NPrintAttrs,ctx);
                xmlFreePropList((xmlAttrPtr)0x0);
                xmlListDelete(pxVar12);
              }
              else {
                if (local_90 == (xmlNodePtr)0x0) {
                  local_90 = (xmlNodePtr)xmlC14NFindHiddenParentAttr(ctx,cur->parent,"lang",pxVar11)
                  ;
                }
                if (local_90 != (xmlNodePtr)0x0) {
                  xmlListInsert(pxVar12,local_90);
                }
                if (local_98 == (xmlNodePtr)0x0) {
                  local_98 = (xmlNodePtr)
                             xmlC14NFindHiddenParentAttr(ctx,cur->parent,"space",pxVar11);
                }
                if (local_98 != (xmlNodePtr)0x0) {
                  xmlListInsert(pxVar12,local_98);
                }
                if (pxVar15 == (xmlNodePtr)0x0) {
                  pxVar15 = (xmlNodePtr)xmlC14NFindHiddenParentAttr(ctx,cur->parent,"base",pxVar11);
                }
                if (pxVar15 == (xmlNodePtr)0x0) {
LAB_001602b9:
                  pxVar17 = (xmlAttrPtr)0x0;
                }
                else {
                  if (pxVar15->parent == (_xmlNode *)0x0) {
                    xmlC14NErrFull(ctx,(xmlNodePtr)0x0,0x73,(char *)0x0,"Invalid argument\n",0);
                  }
                  else {
                    local_90 = (xmlNodePtr)xmlNodeListGetString(ctx->doc,pxVar15->children,1);
                    if (local_90 == (xmlNodePtr)0x0) {
LAB_00160282:
                      ctx->error = 2;
                      xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,
                                          (void *)0x0,0x15,(xmlError *)0x0);
                    }
                    else {
                      node = pxVar15->parent->parent;
                      do {
                        if (((node == (xmlNode *)0x0) ||
                            (ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0)) ||
                           (iVar8 = (*ctx->is_visible_callback)(ctx->user_data,node,node->parent),
                           iVar8 != 0)) {
                          if ((local_90 != (xmlNodePtr)0x0) &&
                             (iVar8 = xmlStrEqual((xmlChar *)local_90,""), iVar8 == 0)) {
                            pxVar17 = xmlNewNsProp((xmlNodePtr)0x0,pxVar15->ns,"base",
                                                   (xmlChar *)local_90);
                            (*xmlFree)(local_90);
                            if (pxVar17 != (xmlAttrPtr)0x0) goto LAB_0016029f;
                            goto LAB_00160282;
                          }
                          (*xmlFree)(local_90);
                          break;
                        }
                        pxVar17 = xmlHasNsProp(node,"base",
                                               (xmlChar *)"http://www.w3.org/XML/1998/namespace");
                        if (pxVar17 == (xmlAttrPtr)0x0) {
LAB_00160120:
                          node = node->parent;
                          bVar4 = true;
                        }
                        else {
                          str = (xmlURIPtr)xmlNodeListGetString(ctx->doc,pxVar17->children,1);
                          if (str == (xmlURIPtr)0x0) {
                            (*xmlFree)(local_90);
                          }
                          else {
                            uVar10 = xmlStrlen((xmlChar *)str);
                            base = str;
                            if ((((int)uVar10 < 2) ||
                                (*(xmlChar *)((long)str + ((ulong)uVar10 - 2)) != '.')) ||
                               (local_68.next = (_xmlNs *)xmlStrcat((xmlChar *)str,"/"),
                               base = (xmlURIPtr)local_68.next,
                               (xmlURIPtr)local_68.next != (xmlURIPtr)0x0)) {
                              iVar8 = xmlBuildURISafe((xmlChar *)local_90,(xmlChar *)base,
                                                      (xmlChar **)&local_68);
                              (*xmlFree)(base);
                              (*xmlFree)(local_90);
                              if (iVar8 == 0) {
                                local_90 = (xmlNodePtr)local_68.next;
                                goto LAB_00160120;
                              }
                              if (iVar8 < 0) {
                                ctx->error = 2;
                                bVar4 = false;
                                xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,
                                                    (xmlGenericErrorFunc)0x0,(void *)0x0,0x15,
                                                    (xmlError *)0x0);
                              }
                              else {
                                bVar4 = false;
                                xmlC14NErrFull(ctx,node,0x5b,(char *)0x0,"%s",
                                               "processing xml:base attribute - can\'t construct uri"
                                              );
                              }
                              goto LAB_00160127;
                            }
                            (*xmlFree)(str);
                            (*xmlFree)(local_90);
                          }
                          ctx->error = 2;
                          bVar4 = false;
                          xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,
                                              (void *)0x0,0x15,(xmlError *)0x0);
                        }
LAB_00160127:
                      } while (bVar4);
                    }
                  }
                  pxVar17 = (xmlAttrPtr)0x0;
LAB_0016029f:
                  if (pxVar17 == (xmlAttrPtr)0x0) goto LAB_001602b9;
                  xmlListInsert(pxVar12,pxVar17);
                  pxVar17->next = (_xmlAttr *)0x0;
                }
LAB_001602bb:
                xmlListWalk(pxVar12,xmlC14NPrintAttrs,ctx);
                xmlFreePropList(pxVar17);
                xmlListDelete(pxVar12);
                if (iVar5 != 0) {
                  xmlOutputBufferWriteString(ctx->buf,">");
                }
              }
              if ((cur->children == (xmlNodePtr)0x0) ||
                 (iVar8 = xmlC14NProcessNodeList(ctx,cur->children), -1 < iVar8)) {
                if (iVar5 != 0) {
                  xmlOutputBufferWriteString(ctx->buf,"</");
                  if ((cur->ns != (xmlNs *)0x0) && (iVar5 = xmlStrlen(cur->ns->prefix), 0 < iVar5))
                  {
                    xmlOutputBufferWriteString(ctx->buf,(char *)cur->ns->prefix);
                    xmlOutputBufferWriteString(ctx->buf,":");
                  }
                  xmlOutputBufferWriteString(ctx->buf,(char *)cur->name);
                  xmlOutputBufferWriteString(ctx->buf,">");
                  if (local_74 != 0) {
                    ctx->parent_is_doc = local_74;
                    ctx->pos = XMLC14N_AFTER_DOCUMENT_ELEMENT;
                  }
                }
                p_Var3 = ctx->ns_rendered;
                if (p_Var3 == (xmlC14NVisibleNsStackPtr)0x0) {
                  iVar6 = 0;
                  xmlC14NErrFull((xmlC14NCtxPtr)0x0,(xmlNodePtr)0x0,0x73,(char *)0x0,
                                 "Invalid argument\n",0);
                }
                else {
                  p_Var3->nsCurEnd = iVar6;
                  p_Var3->nsPrevStart = local_70;
                  p_Var3->nsPrevEnd = iVar7;
                  iVar6 = 0;
                }
                break;
              }
              goto LAB_0015fca4;
            }
          }
LAB_0015fc87:
          iVar6 = 0x73;
          pcVar18 = (char *)0x0;
          msg = "Invalid argument\n";
          pcVar19 = (char *)0x0;
          pxVar13 = (xmlNodePtr)0x0;
          goto LAB_0015fc9d;
        }
        if (cur->type != XML_ELEMENT_NODE) goto LAB_0015fc87;
        pxVar12 = xmlListCreate((xmlListDeallocator)0x0,xmlC14NNsCompare);
        if (pxVar12 != (xmlListPtr)0x0) {
          uVar10 = 0;
          bVar4 = false;
          if (ctx->inclusive_ns_prefixes == (xmlChar **)0x0) {
LAB_0015f963:
            pxVar13 = (xmlNodePtr)cur->ns;
            bVar22 = pxVar13 == (xmlNodePtr)0x0;
            if (bVar22) {
              pxVar13 = (xmlNodePtr)xmlSearchNs(cur->doc,cur,(xmlChar *)0x0);
            }
            if ((pxVar13 != (xmlNodePtr)0x0) &&
               (iVar8 = xmlC14NIsXmlNs((xmlNsPtr)pxVar13), iVar8 == 0)) {
              if (iVar5 != 0) {
                if (((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0) ||
                    (iVar8 = (*ctx->is_visible_callback)(ctx->user_data,pxVar13,cur), iVar8 != 0))
                   && (iVar8 = xmlExcC14NVisibleNsStackFind(ctx->ns_rendered,(xmlNsPtr)pxVar13,ctx),
                      iVar8 == 0)) {
                  xmlListInsert(pxVar12,pxVar13);
                }
                iVar8 = xmlC14NVisibleNsStackAdd(ctx->ns_rendered,(xmlNsPtr)pxVar13,cur);
                if (iVar8 < 0) {
                  if (ctx != (xmlC14NCtxPtr)0x0) {
                    ctx->error = 2;
                  }
                  pxVar11 = (xmlChar *)0x15;
                  xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,
                                      (void *)0x0,0x15,(xmlError *)0x0);
                  goto LAB_0015fbc5;
                }
              }
              iVar8 = xmlStrlen((xmlChar *)pxVar13->children);
              if (iVar8 == 0) {
                uVar10 = 1;
              }
            }
            for (pxVar13 = (xmlNodePtr)cur->properties; pxVar13 != (xmlNodePtr)0x0;
                pxVar13 = pxVar13->next) {
              if (((pxVar13->ns == (xmlNsPtr)0x0) ||
                  (iVar8 = xmlC14NIsXmlNs(pxVar13->ns), iVar8 != 0)) ||
                 ((ctx->is_visible_callback != (xmlC14NIsVisibleCallback)0x0 &&
                  (iVar8 = (*ctx->is_visible_callback)(ctx->user_data,pxVar13,cur), iVar8 == 0)))) {
                if ((pxVar13->ns != (xmlNs *)0x0) &&
                   (iVar8 = xmlStrlen(pxVar13->ns->prefix), iVar8 == 0)) {
                  iVar8 = xmlStrlen(pxVar13->ns->href);
                  if (iVar8 == 0) {
                    bVar22 = true;
                  }
                  pxVar11 = (xmlChar *)0x0;
                }
              }
              else {
                iVar8 = xmlExcC14NVisibleNsStackFind(ctx->ns_rendered,pxVar13->ns,ctx);
                iVar9 = xmlC14NVisibleNsStackAdd(ctx->ns_rendered,pxVar13->ns,cur);
                if (iVar9 < 0) {
                  if (ctx != (xmlC14NCtxPtr)0x0) {
                    ctx->error = 2;
                  }
                  pxVar11 = (xmlChar *)0x15;
                  xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,
                                      (void *)0x0,0x15,(xmlError *)0x0);
                  goto LAB_0015fbc5;
                }
                if ((iVar5 != 0) && (iVar8 == 0)) {
                  xmlListInsert(pxVar12,pxVar13->ns);
                }
                iVar8 = xmlStrlen(pxVar13->ns->prefix);
                if (iVar8 == 0) {
                  uVar10 = 1;
                }
              }
            }
            uVar16 = (undefined7)((ulong)pxVar11 >> 8);
            pxVar11 = (xmlChar *)CONCAT71(uVar16,!bVar22 || iVar5 == 0);
            if ((bVar4 || uVar10 != 0) || (!bVar22 || iVar5 == 0)) {
              pxVar11 = (xmlChar *)CONCAT71(uVar16,uVar10 == 0);
              if ((iVar5 == 0 || !bVar4) || uVar10 != 0) goto LAB_0015fbbb;
              local_68._private = (void *)0x0;
              local_68.context = (_xmlDoc *)0x0;
              local_68.href = (xmlChar *)0x0;
              local_68.prefix = (xmlChar *)0x0;
              local_68.next = (_xmlNs *)0x0;
              local_68.type = 0;
              local_68._12_4_ = 0;
              iVar8 = xmlC14NVisibleNsStackFind(ctx->ns_rendered,&local_68);
            }
            else {
              local_68._private = (void *)0x0;
              local_68.context = (_xmlDoc *)0x0;
              local_68.href = (xmlChar *)0x0;
              local_68.prefix = (xmlChar *)0x0;
              local_68.next = (_xmlNs *)0x0;
              local_68.type = 0;
              local_68._12_4_ = 0;
              iVar8 = xmlExcC14NVisibleNsStackFind(ctx->ns_rendered,&local_68,ctx);
            }
            if (iVar8 == 0) {
              xmlC14NPrintNamespaces(&local_68,ctx);
            }
            goto LAB_0015fbbb;
          }
          str1 = *ctx->inclusive_ns_prefixes;
          if (str1 == (xmlChar *)0x0) {
            uVar10 = 0;
            bVar4 = false;
            iVar8 = 0;
          }
          else {
            bVar4 = false;
            lVar20 = 8;
            uVar10 = 0;
            do {
              iVar8 = xmlStrEqual(str1,(xmlChar *)"#default");
              if ((iVar8 != 0) || (iVar8 = xmlStrEqual(str1,""), iVar8 != 0)) {
                bVar4 = true;
                str1 = (xmlChar *)0x0;
              }
              pxVar13 = (xmlNodePtr)xmlSearchNs(cur->doc,cur,str1);
              if (((pxVar13 != (xmlNodePtr)0x0) &&
                  (iVar8 = xmlC14NIsXmlNs((xmlNsPtr)pxVar13), iVar8 == 0)) &&
                 ((ctx->is_visible_callback == (xmlC14NIsVisibleCallback)0x0 ||
                  (iVar8 = (*ctx->is_visible_callback)(ctx->user_data,pxVar13,cur), iVar8 != 0)))) {
                iVar8 = xmlC14NVisibleNsStackFind(ctx->ns_rendered,(xmlNsPtr)pxVar13);
                if ((iVar5 != 0) &&
                   (iVar9 = xmlC14NVisibleNsStackAdd(ctx->ns_rendered,(xmlNsPtr)pxVar13,cur),
                   iVar9 < 0)) {
                  if (ctx != (xmlC14NCtxPtr)0x0) {
                    ctx->error = 2;
                  }
                  pxVar11 = (xmlChar *)0x15;
                  xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,
                                      (void *)0x0,0x15,(xmlError *)0x0);
                  iVar8 = 5;
                  goto LAB_0015f94b;
                }
                if (iVar8 == 0) {
                  xmlListInsert(pxVar12,pxVar13);
                }
                iVar8 = xmlStrlen((xmlChar *)pxVar13->children);
                if (iVar8 == 0) {
                  uVar10 = 1;
                }
                pxVar11 = (xmlChar *)(ulong)uVar10;
              }
              str1 = *(xmlChar **)((long)ctx->inclusive_ns_prefixes + lVar20);
              lVar20 = lVar20 + 8;
            } while (str1 != (xmlChar *)0x0);
            iVar8 = 0;
          }
LAB_0015f94b:
          if (iVar8 == 5) goto LAB_0015fbc5;
          if (iVar8 == 0) goto LAB_0015f963;
          goto LAB_0015fbd4;
        }
LAB_0015fcc5:
        if (ctx != (xmlC14NCtxPtr)0x0) {
          ctx->error = 2;
        }
        xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0x15,
                            (xmlError *)0x0);
        goto LAB_0015fca4;
      case XML_ATTRIBUTE_NODE:
        iVar6 = 0x7a1;
        pcVar18 = "processing node";
        msg = "Node %s is invalid here : %s\n";
        pcVar19 = "XML_ATTRIBUTE_NODE";
        pxVar13 = (xmlNodePtr)0x0;
        goto LAB_0015fc9d;
      case XML_TEXT_NODE:
      case XML_CDATA_SECTION_NODE:
        iVar6 = iVar7;
        if ((iVar5 != 0) && (cur->content != (xmlChar *)0x0)) {
          pxVar11 = xmlC11NNormalizeString(cur->content,XMLC14N_NORMALIZE_TEXT);
          if (pxVar11 == (xmlChar *)0x0) {
            if (ctx != (xmlC14NCtxPtr)0x0) {
              ctx->error = 2;
            }
            xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,
                                0x15,(xmlError *)0x0);
          }
          else {
            xmlOutputBufferWriteString(ctx->buf,(char *)pxVar11);
            (*xmlFree)(pxVar11);
          }
          iVar6 = -(uint)(pxVar11 == (xmlChar *)0x0);
        }
        break;
      case XML_ENTITY_REF_NODE:
        iVar6 = 0x7a1;
        pcVar18 = "processing node";
        msg = "Node %s is invalid here : %s\n";
        pcVar19 = "XML_ENTITY_REF_NODE";
        pxVar13 = (xmlNodePtr)0x0;
        goto LAB_0015fc9d;
      case XML_ENTITY_NODE:
        iVar6 = 0x7a1;
        msg = "Node %s is invalid here : %s\n";
        pcVar19 = "XML_ENTITY_NODE";
        pxVar13 = (xmlNodePtr)0x0;
        goto LAB_0015fc9d;
      case XML_PI_NODE:
        iVar6 = iVar7;
        if (iVar5 != 0) {
          pcVar18 = "<?";
          if (ctx->pos == XMLC14N_AFTER_DOCUMENT_ELEMENT) {
            pcVar18 = "\n<?";
          }
          xmlOutputBufferWriteString(ctx->buf,pcVar18);
          xmlOutputBufferWriteString(ctx->buf,(char *)cur->name);
          if ((cur->content != (xmlChar *)0x0) && (*cur->content != '\0')) {
            xmlOutputBufferWriteString(ctx->buf," ");
            pxVar11 = xmlC11NNormalizeString(cur->content,XMLC14N_NORMALIZE_PI);
            if (pxVar11 == (xmlChar *)0x0) {
              if (ctx != (xmlC14NCtxPtr)0x0) {
                ctx->error = 2;
              }
              xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,
                                  0x15,(xmlError *)0x0);
            }
            else {
              xmlOutputBufferWriteString(ctx->buf,(char *)pxVar11);
              (*xmlFree)(pxVar11);
            }
            if (pxVar11 == (xmlChar *)0x0) goto LAB_0015fca4;
          }
          out = ctx->buf;
          if (ctx->pos == XMLC14N_BEFORE_DOCUMENT_ELEMENT) {
            pcVar18 = "?>\n";
          }
          else {
            pcVar18 = "?>";
          }
LAB_0015f8f4:
          xmlOutputBufferWriteString(out,pcVar18);
          iVar6 = iVar7;
        }
        break;
      case XML_COMMENT_NODE:
        iVar6 = iVar7;
        if ((iVar5 != 0) && (ctx->with_comments != 0)) {
          pcVar18 = "<!--";
          if (ctx->pos == XMLC14N_AFTER_DOCUMENT_ELEMENT) {
            pcVar18 = "\n<!--";
          }
          xmlOutputBufferWriteString(ctx->buf,pcVar18);
          if (cur->content != (xmlChar *)0x0) {
            pxVar11 = xmlC11NNormalizeString(cur->content,XMLC14N_NORMALIZE_COMMENT);
            if (pxVar11 == (xmlChar *)0x0) {
              if (ctx != (xmlC14NCtxPtr)0x0) {
                ctx->error = 2;
              }
              xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,
                                  0x15,(xmlError *)0x0);
            }
            else {
              xmlOutputBufferWriteString(ctx->buf,(char *)pxVar11);
              (*xmlFree)(pxVar11);
            }
            if (pxVar11 == (xmlChar *)0x0) goto LAB_0015fca4;
          }
          if (ctx->pos == XMLC14N_BEFORE_DOCUMENT_ELEMENT) {
            out = ctx->buf;
            pcVar18 = "-->\n";
          }
          else {
            out = ctx->buf;
            pcVar18 = "-->";
          }
          goto LAB_0015f8f4;
        }
        break;
      case XML_DOCUMENT_NODE:
      case XML_DOCUMENT_FRAG_NODE:
      case XML_HTML_DOCUMENT_NODE:
        pxVar13 = cur->children;
        if (pxVar13 != (xmlNodePtr)0x0) {
          ctx->pos = XMLC14N_BEFORE_DOCUMENT_ELEMENT;
          ctx->parent_is_doc = 1;
          iVar6 = xmlC14NProcessNodeList(ctx,pxVar13);
        }
        break;
      case XML_DOCUMENT_TYPE_NODE:
      case XML_NOTATION_NODE:
      case XML_DTD_NODE:
      case XML_ELEMENT_DECL:
      case XML_ATTRIBUTE_DECL:
      case XML_ENTITY_DECL:
      case XML_XINCLUDE_START:
      case XML_XINCLUDE_END:
        break;
      case XML_NAMESPACE_DECL:
        iVar6 = 0x7a1;
        msg = "Node %s is invalid here : %s\n";
        pcVar19 = "XML_NAMESPACE_DECL";
        pxVar13 = (xmlNodePtr)0x0;
LAB_0015fc9d:
        xmlC14NErrFull(ctx,pxVar13,iVar6,pcVar18,msg,pcVar19);
LAB_0015fca4:
        iVar6 = -1;
        break;
      default:
        xmlC14NErrFull(ctx,(xmlNodePtr)0x0,0x7a2,"processing node",
                       "Unknown node type %d found : %s\n",(ulong)cur->type,"processing node");
        goto LAB_0015fca4;
      }
      cur = cur->next;
    } while ((cur != (_xmlNode *)0x0) && (-1 < iVar6));
  }
  return iVar6;
}

Assistant:

static int
xmlC14NProcessNodeList(xmlC14NCtxPtr ctx, xmlNodePtr cur)
{
    int ret;

    if (ctx == NULL) {
        xmlC14NErrParam(ctx);
        return (-1);
    }

    for (ret = 0; cur != NULL && ret >= 0; cur = cur->next) {
        ret = xmlC14NProcessNode(ctx, cur);
    }
    return (ret);
}